

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::belowmouse(Fl_Widget *o)

{
  int iVar1;
  int iVar2;
  Fl_Window *pFVar3;
  bool bVar4;
  Fl_Group *pFStack_18;
  int old_event;
  Fl_Widget *p;
  Fl_Widget *o_local;
  
  pFVar3 = grab();
  iVar1 = e_number;
  if ((pFVar3 == (Fl_Window *)0x0) && (pFStack_18 = (Fl_Group *)belowmouse_, o != belowmouse_)) {
    e_number = 4;
    belowmouse_ = o;
    if (dnd_flag != '\0') {
      e_number = 0x16;
    }
    while( true ) {
      bVar4 = false;
      if (pFStack_18 != (Fl_Group *)0x0) {
        iVar2 = Fl_Widget::contains(&pFStack_18->super_Fl_Widget,o);
        bVar4 = iVar2 == 0;
      }
      if (!bVar4) break;
      (*(pFStack_18->super_Fl_Widget)._vptr_Fl_Widget[3])(pFStack_18,(ulong)(uint)e_number);
      pFStack_18 = Fl_Widget::parent(&pFStack_18->super_Fl_Widget);
    }
  }
  e_number = iVar1;
  return;
}

Assistant:

void Fl::belowmouse(Fl_Widget *o) {
  if (grab()) return; // don't do anything while grab is on
  Fl_Widget *p = belowmouse_;
  if (o != p) {
    belowmouse_ = o;
    int old_event = e_number;
    e_number = dnd_flag ? FL_DND_LEAVE : FL_LEAVE;
    for (; p && !p->contains(o); p = p->parent()) {
      p->handle(e_number);
    }
    e_number = old_event;
  }
}